

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  uint uVar174;
  int iVar175;
  uint uVar176;
  uint uVar177;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uint uVar178;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  secp256k1_gej *psVar179;
  secp256k1_gej *psVar180;
  ulong uVar181;
  void *pvVar182;
  secp256k1_gej *in_RCX;
  secp256k1_gej *a_00;
  uint extraout_EDX;
  ulong uVar183;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *extraout_RDX_00;
  ulong extraout_RDX_01;
  secp256k1_ge *a_01;
  secp256k1_gej *psVar184;
  long lVar185;
  ulong uVar186;
  uint64_t unaff_RBP;
  uint64_t uVar187;
  long lVar188;
  secp256k1_gej *psVar189;
  ulong uVar190;
  secp256k1_gej *psVar191;
  undefined8 *puVar192;
  secp256k1_gej *psVar193;
  secp256k1_gej *psVar194;
  ulong uVar195;
  ulong uVar196;
  secp256k1_fe *psVar197;
  undefined8 *puVar198;
  uint64_t *puVar199;
  secp256k1_gej *in_R8;
  uint64_t *in_R9;
  uint64_t unaff_R12;
  uint64_t uVar200;
  uint64_t unaff_R13;
  ulong uVar201;
  secp256k1_fe *unaff_R15;
  uint64_t uVar202;
  bool bVar203;
  byte bVar204;
  undefined1 auVar205 [16];
  secp256k1_fe na;
  undefined1 auStack_8a8 [104];
  ulong uStack_840;
  ulong uStack_838;
  ulong uStack_830;
  ulong uStack_828;
  ulong uStack_820;
  undefined1 auStack_818 [56];
  uint64_t uStack_7e0;
  uint64_t uStack_7d8;
  uint64_t uStack_7d0;
  uint64_t uStack_7c8;
  int iStack_7c0;
  undefined1 auStack_7b8 [56];
  uint64_t uStack_780;
  uint64_t uStack_778;
  uint64_t uStack_770;
  uint64_t uStack_768;
  int iStack_760;
  int iStack_75c;
  ulong uStack_758;
  secp256k1_gej *psStack_750;
  undefined1 auStack_748 [104];
  ulong uStack_6e0;
  ulong uStack_6d8;
  ulong uStack_6d0;
  uint64_t uStack_6c8;
  undefined8 uStack_6c0;
  undefined1 auStack_6b8 [96];
  secp256k1_gej *psStack_658;
  secp256k1_gej *psStack_648;
  secp256k1_gej *psStack_640;
  int iStack_634;
  secp256k1_gej *psStack_630;
  undefined1 auStack_628 [48];
  secp256k1_gej *psStack_5f8;
  secp256k1_gej *psStack_5f0;
  secp256k1_gej *psStack_5e8;
  secp256k1_gej *psStack_5e0;
  secp256k1_gej *psStack_5d8;
  secp256k1_gej *psStack_5d0;
  secp256k1_gej *psStack_5c8;
  secp256k1_gej *psStack_5c0;
  uint64_t *puStack_5b8;
  secp256k1_gej *psStack_5b0;
  uint64_t uStack_5a8;
  secp256k1_gej *psStack_5a0;
  undefined1 auStack_598 [56];
  uint64_t uStack_560;
  uint64_t uStack_558;
  uint64_t uStack_550;
  uint64_t uStack_548;
  undefined8 uStack_540;
  undefined1 auStack_530 [24];
  undefined1 auStack_518 [16];
  undefined8 uStack_508;
  undefined1 auStack_500 [16];
  undefined1 auStack_4f0 [16];
  undefined1 auStack_4e0 [32];
  secp256k1_scalar asStack_4c0 [16];
  secp256k1_gej asStack_2b0 [3];
  secp256k1_fe *psStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  code *pcStack_80;
  uint64_t local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  
  bVar204 = 0;
  pcStack_80 = (code *)0x1508cd;
  psVar191 = (secp256k1_gej *)b;
  secp256k1_fe_verify(a);
  pcStack_80 = (code *)0x1508d5;
  psVar194 = (secp256k1_gej *)b;
  secp256k1_fe_verify(b);
  if (a->magnitude < 2) {
    if (0x1f < b->magnitude) goto LAB_00150a7c;
    pcStack_80 = (code *)0x1508f2;
    psVar194 = (secp256k1_gej *)a;
    secp256k1_fe_verify(a);
    if (a->magnitude < 2) {
      local_68 = 0x3ffffbfffff0bc - a->n[0];
      unaff_R15 = &local_60;
      unaff_R12 = 0x3ffffffffffffc - a->n[1];
      unaff_RBP = 0x3ffffffffffffc - a->n[2];
      local_70 = 0x3ffffffffffffc - a->n[3];
      unaff_R13 = 0x3fffffffffffc - a->n[4];
      local_60.magnitude = 2;
      local_60.normalized = 0;
      pcStack_80 = (code *)0x150966;
      local_60.n[0] = local_68;
      local_60.n[1] = unaff_R12;
      local_60.n[2] = unaff_RBP;
      local_60.n[3] = local_70;
      local_60.n[4] = unaff_R13;
      secp256k1_fe_verify(unaff_R15);
      pcStack_80 = (code *)0x15096e;
      secp256k1_fe_verify(unaff_R15);
      pcStack_80 = (code *)0x150976;
      psVar194 = (secp256k1_gej *)b;
      secp256k1_fe_verify(b);
      if (b->magnitude < 0x1f) {
        uVar202 = local_68 + b->n[0];
        uVar200 = unaff_R12 + b->n[1];
        uVar187 = unaff_RBP + b->n[2];
        local_70 = local_70 + b->n[3];
        uVar201 = unaff_R13 + b->n[4];
        local_60.normalized = 0;
        local_60.magnitude = b->magnitude + 2;
        pcStack_80 = (code *)0x1509d3;
        local_60.n[0] = uVar202;
        local_60.n[1] = uVar200;
        local_60.n[2] = uVar187;
        local_60.n[3] = local_70;
        local_60.n[4] = uVar201;
        secp256k1_fe_verify(&local_60);
        pcStack_80 = (code *)0x1509db;
        secp256k1_fe_verify(&local_60);
        uVar190 = (uVar201 >> 0x30) * 0x1000003d1 + uVar202;
        uVar183 = (uVar190 >> 0x34) + uVar200;
        uVar195 = (uVar183 >> 0x34) + uVar187;
        uVar196 = (uVar195 >> 0x34) + local_70;
        uVar201 = (uVar196 >> 0x34) + (uVar201 & 0xffffffffffff);
        return (int)(((uVar190 ^ 0x1000003d0) & uVar183 & uVar195 & uVar196 &
                     (uVar201 ^ 0xf000000000000)) == 0xfffffffffffff ||
                    ((uVar183 | uVar190 | uVar195 | uVar196) & 0xfffffffffffff) == 0 && uVar201 == 0
                    );
      }
      goto LAB_00150a86;
    }
  }
  else {
    pcStack_80 = (code *)0x150a7c;
    secp256k1_fe_equal_cold_4();
LAB_00150a7c:
    pcStack_80 = (code *)0x150a81;
    secp256k1_fe_equal_cold_3();
  }
  pcStack_80 = (code *)0x150a86;
  secp256k1_fe_equal_cold_2();
LAB_00150a86:
  pcStack_80 = secp256k1_ecmult_strauss_wnaf;
  secp256k1_fe_equal_cold_1();
  auStack_530._0_8_ = 1;
  auStack_530._8_16_ = (undefined1  [16])0x0;
  auStack_518 = (undefined1  [16])0x0;
  uStack_508._0_4_ = 1;
  uStack_508._4_4_ = 1;
  psStack_5d8 = (secp256k1_gej *)0x150ae2;
  a_00 = in_RCX;
  psVar179 = in_R8;
  puStack_5b8 = in_R9;
  psStack_5b0 = psVar191;
  psStack_a8 = b;
  uStack_a0 = unaff_R12;
  uStack_98 = unaff_R13;
  psStack_90 = a;
  psStack_88 = unaff_R15;
  pcStack_80 = (code *)unaff_RBP;
  secp256k1_fe_verify((secp256k1_fe *)auStack_530);
  if (extraout_RDX == (secp256k1_gej *)0x0) {
    psStack_5d0 = (secp256k1_gej *)0x0;
    psVar191 = (secp256k1_gej *)0x0;
  }
  else {
    psVar191 = (secp256k1_gej *)0x0;
    psVar180 = asStack_2b0;
    psStack_5d0 = (secp256k1_gej *)0x0;
    uVar183 = extraout_RAX;
    psVar189 = extraout_RDX;
    do {
      auVar205._0_4_ = -(uint)((int)(in_R8->x).n[2] == 0 && (int)(in_R8->x).n[0] == 0);
      auVar205._4_4_ =
           -(uint)(*(int *)((long)(in_R8->x).n + 0x14) == 0 && *(int *)((long)(in_R8->x).n + 4) == 0
                  );
      auVar205._8_4_ = -(uint)((int)(in_R8->x).n[3] == 0 && (int)(in_R8->x).n[1] == 0);
      auVar205._12_4_ =
           -(uint)(*(int *)((long)(in_R8->x).n + 0x1c) == 0 &&
                  *(int *)((long)(in_R8->x).n + 0xc) == 0);
      uVar174 = movmskps((int)uVar183,auVar205);
      uVar183 = (ulong)(uVar174 ^ 0xf);
      if ((uVar174 ^ 0xf) != 0) {
        psStack_5d8 = (secp256k1_gej *)0x150b2a;
        secp256k1_gej_verify(in_RCX);
        uVar183 = extraout_RAX_00;
        if (in_RCX->infinity == 0) {
          psStack_5d8 = (secp256k1_gej *)0x150b4d;
          secp256k1_scalar_split_lambda
                    (asStack_4c0,(secp256k1_scalar *)auStack_598,(secp256k1_scalar *)in_R8);
          psVar184 = (secp256k1_gej *)((long)psVar191 * 0x410);
          psStack_5d8 = (secp256k1_gej *)0x150b77;
          psStack_5c8 = psVar191;
          iVar175 = secp256k1_ecmult_wnaf
                              ((int *)((long)(psVar184->x).n + (psVar194->x).n[2]),0x81,asStack_4c0,
                               5);
          uVar187 = (psVar194->x).n[2];
          psVar193 = (secp256k1_gej *)((long)psVar184[3].y.n + uVar187 + 0xc);
          *(int *)((long)psVar184[6].z.n + uVar187 + 0x18) = iVar175;
          psVar191 = (secp256k1_gej *)0x81;
          psStack_5d8 = (secp256k1_gej *)0x150ba0;
          uVar176 = secp256k1_ecmult_wnaf((int *)psVar193,0x81,(secp256k1_scalar *)auStack_598,5);
          uVar187 = (psVar194->x).n[2];
          *(uint *)((long)psVar184[6].z.n + uVar187 + 0x1c) = uVar176;
          uVar174 = *(uint *)((long)psVar184[6].z.n + uVar187 + 0x18);
          a_00 = (secp256k1_gej *)(ulong)uVar174;
          if (0x81 < (int)uVar174) goto LAB_00151180;
          if (0x81 < *(int *)((long)psVar184[6].z.n + uVar187 + 0x1c)) goto LAB_00151185;
          if ((int)uVar174 <= (int)psStack_5d0) {
            a_00 = (secp256k1_gej *)((ulong)psStack_5d0 & 0xffffffff);
          }
          if ((int)a_00 < (int)uVar176) {
            a_00 = (secp256k1_gej *)(ulong)uVar176;
          }
          psStack_5d8 = (secp256k1_gej *)0x150bf4;
          psStack_5d0 = a_00;
          memcpy(psVar180,in_RCX,0x98);
          if (psStack_5c8 != (secp256k1_gej *)0x0) {
            psStack_5d8 = (secp256k1_gej *)0x150c15;
            secp256k1_gej_rescale(psVar180,(secp256k1_fe *)auStack_530);
          }
          psVar191 = psStack_5c8;
          psStack_5d8 = (secp256k1_gej *)0x150c3e;
          a_00 = psVar180;
          secp256k1_ecmult_odd_multiples_table
                    ((int)psStack_5c8 * 0x340 + (int)(psVar194->x).n[1],
                     (secp256k1_ge *)((long)psStack_5c8 * 0x180 + (psVar194->x).n[0]),
                     (secp256k1_fe *)auStack_530,&psVar180->x,psVar179);
          uVar183 = extraout_RAX_01;
          if (psVar191 != (secp256k1_gej *)0x0) {
            psVar197 = (secp256k1_fe *)((long)psVar191 * 0x180 + (psVar194->x).n[0]);
            psStack_5d8 = (secp256k1_gej *)0x150c62;
            secp256k1_fe_mul(psVar197,psVar197,&in_RCX->z);
            uVar183 = extraout_RAX_02;
          }
          psVar191 = (secp256k1_gej *)((long)(psVar191->x).n + 1);
        }
      }
      in_RCX = in_RCX + 1;
      in_R8 = (secp256k1_gej *)((in_R8->x).n + 4);
      psVar189 = (secp256k1_gej *)&psVar189[-1].field_0x97;
    } while (psVar189 != (secp256k1_gej *)0x0);
  }
  psStack_5c8 = psVar191;
  if (psVar191 != (secp256k1_gej *)0x0) {
    psStack_5d8 = (secp256k1_gej *)0x150ca8;
    secp256k1_ge_table_set_globalz
              ((long)psVar191 * 8,(secp256k1_ge *)(psVar194->x).n[1],
               (secp256k1_fe *)(psVar194->x).n[0]);
    lVar185 = 0;
    psVar191 = (secp256k1_gej *)0x0;
    psVar179 = (secp256k1_gej *)0x0;
    do {
      lVar188 = 0;
      psStack_5c0 = psVar191;
      do {
        psStack_5d8 = (secp256k1_gej *)0x150cd6;
        secp256k1_fe_mul((secp256k1_fe *)((psVar194->x).n[0] + lVar185 + lVar188),
                         (secp256k1_fe *)((long)(psVar191->x).n + (psVar194->x).n[1]),
                         &secp256k1_const_beta);
        psVar191 = (secp256k1_gej *)((psVar191->z).n + 1);
        lVar188 = lVar188 + 0x30;
      } while (lVar188 != 0x180);
      psVar179 = (secp256k1_gej *)((long)(psVar179->x).n + 1);
      psVar191 = (secp256k1_gej *)(psStack_5c0[5].y.n + 3);
      lVar185 = lVar185 + 0x180;
    } while (psVar179 != psStack_5c8);
  }
  if (puStack_5b8 == (uint64_t *)0x0) {
    puStack_5b8 = (uint64_t *)0x0;
    uStack_5a8 = 0;
    uVar174 = (uint)psStack_5d0;
  }
  else {
    auStack_4e0._0_8_ = *puStack_5b8;
    auStack_4e0._8_8_ = puStack_5b8[1];
    auStack_4e0._16_16_ = (undefined1  [16])0x0;
    auStack_500 = *(undefined1 (*) [16])(puStack_5b8 + 2);
    auStack_4f0 = (undefined1  [16])0x0;
    psStack_5d8 = (secp256k1_gej *)0x150d58;
    uVar176 = secp256k1_ecmult_wnaf((int *)asStack_2b0,0x81,(secp256k1_scalar *)auStack_4e0,0xf);
    a_00 = (secp256k1_gej *)0xf;
    psStack_5d8 = (secp256k1_gej *)0x150d74;
    uVar177 = secp256k1_ecmult_wnaf((int *)asStack_4c0,0x81,(secp256k1_scalar *)auStack_500,0xf);
    uVar174 = (uint)psStack_5d0;
    if ((int)(uint)psStack_5d0 < (int)uVar176) {
      uVar174 = uVar176;
    }
    if ((int)uVar174 < (int)uVar177) {
      uVar174 = uVar177;
    }
    uStack_5a8 = (uint64_t)(int)uVar177;
    puStack_5b8 = (uint64_t *)(long)(int)uVar176;
  }
  psVar193 = psStack_5b0;
  psStack_5d8 = (secp256k1_gej *)0x150db6;
  secp256k1_gej_set_infinity(psStack_5b0);
  iVar175 = extraout_EAX;
  if (0 < (int)uVar174) {
    psVar179 = (secp256k1_gej *)(ulong)uVar174;
    psStack_5d0 = (secp256k1_gej *)((long)psVar179 * 4 + -4);
    psStack_5a0 = psVar194;
    do {
      psStack_5d8 = (secp256k1_gej *)0x150dde;
      secp256k1_gej_double_var(psVar193,psVar193,(secp256k1_fe *)0x0);
      psStack_5c0 = psVar179;
      psVar191 = psVar179;
      iVar175 = extraout_EAX_00;
      if (psStack_5c8 != (secp256k1_gej *)0x0) {
        in_R8 = (secp256k1_gej *)0x40c;
        in_RCX = (secp256k1_gej *)0x30;
        psVar184 = (secp256k1_gej *)0x0;
        psVar189 = psStack_5d0;
        psVar180 = psStack_5c8;
        do {
          uVar187 = (psVar194->x).n[2];
          a_00 = (secp256k1_gej *)(long)*(int *)((long)(in_R8->x).n + (uVar187 - 4));
          if (((long)psVar191 <= (long)a_00) &&
             (uVar174 = *(uint *)((long)(psVar189->x).n + uVar187), uVar174 != 0)) {
            if ((uVar174 & 1) == 0) {
              psStack_5d8 = (secp256k1_gej *)0x15115d;
              secp256k1_ecmult_strauss_wnaf_cold_6();
LAB_0015115d:
              psStack_5d8 = (secp256k1_gej *)0x151162;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_00151162:
              psStack_5d8 = (secp256k1_gej *)0x151167;
              secp256k1_ecmult_strauss_wnaf_cold_10();
LAB_00151167:
              psStack_5d8 = (secp256k1_gej *)0x15116c;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_0015116c:
              psStack_5d8 = (secp256k1_gej *)0x151171;
              secp256k1_ecmult_strauss_wnaf_cold_7();
LAB_00151171:
              psStack_5d8 = (secp256k1_gej *)0x151176;
              secp256k1_ecmult_strauss_wnaf_cold_9();
            }
            else {
              if ((int)uVar174 < -0xf) goto LAB_0015115d;
              if (0xf < (int)uVar174) goto LAB_00151167;
              uVar187 = (psVar194->x).n[1];
              if (0 < (int)uVar174) {
                puVar192 = (undefined8 *)
                           ((long)&in_RCX->x + uVar187 + (ulong)(uVar174 - 1 >> 1) * 0x68 + -0x30);
                puVar198 = (undefined8 *)auStack_598;
                for (lVar185 = 0xd; lVar185 != 0; lVar185 = lVar185 + -1) {
                  *puVar198 = *puVar192;
                  puVar192 = puVar192 + (ulong)bVar204 * -2 + 1;
                  puVar198 = puVar198 + (ulong)bVar204 * -2 + 1;
                }
LAB_00150f13:
                psStack_5d8 = (secp256k1_gej *)0x150f25;
                psVar193 = psStack_5b0;
                secp256k1_gej_add_ge_var
                          (psStack_5b0,psStack_5b0,(secp256k1_ge *)auStack_598,(secp256k1_fe *)0x0);
                psVar191 = psStack_5c0;
                goto LAB_00150f2a;
              }
              psVar191 = (secp256k1_gej *)
                         ((long)&in_RCX->x + uVar187 + (ulong)(~uVar174 >> 1) * 0x68 + -0x30);
              puVar199 = (uint64_t *)auStack_598;
              for (a_00 = (secp256k1_gej *)0xd; a_00 != (secp256k1_gej *)0x0;
                  a_00 = (secp256k1_gej *)&a_00[-1].field_0x97) {
                *puVar199 = (psVar191->x).n[0];
                psVar191 = (secp256k1_gej *)((long)psVar191 + (ulong)bVar204 * -0x10 + 8);
                puVar199 = puVar199 + (ulong)bVar204 * -2 + 1;
              }
              psVar194 = (secp256k1_gej *)(auStack_598 + 0x30);
              psStack_5d8 = (secp256k1_gej *)0x150e9d;
              psVar193 = psVar194;
              secp256k1_fe_verify((secp256k1_fe *)psVar194);
              if ((int)uStack_540 < 2) {
                auStack_598._48_8_ = 0x3ffffbfffff0bc - auStack_598._48_8_;
                uStack_560 = 0x3ffffffffffffc - uStack_560;
                uStack_558 = 0x3ffffffffffffc - uStack_558;
                uStack_550 = 0x3ffffffffffffc - uStack_550;
                uStack_548 = 0x3fffffffffffc - uStack_548;
                uStack_540._0_4_ = 2;
                uStack_540._4_4_ = 0;
                psStack_5d8 = (secp256k1_gej *)0x150f09;
                secp256k1_fe_verify((secp256k1_fe *)psVar194);
                psVar194 = psStack_5a0;
                goto LAB_00150f13;
              }
            }
            psStack_5d8 = (secp256k1_gej *)0x15117b;
            secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_0015117b:
            psStack_5d8 = (secp256k1_gej *)0x151180;
            secp256k1_ecmult_strauss_wnaf_cold_8();
            goto LAB_00151180;
          }
LAB_00150f2a:
          uVar187 = (psVar194->x).n[2];
          a_00 = (secp256k1_gej *)(long)*(int *)((long)(in_R8->x).n + uVar187);
          if (((long)psVar191 <= (long)a_00) &&
             (uVar174 = *(uint *)((long)psVar189[3].y.n + uVar187 + 0xc), uVar174 != 0)) {
            if ((uVar174 & 1) == 0) goto LAB_00151162;
            if ((int)uVar174 < -0xf) goto LAB_0015116c;
            if (0xf < (int)uVar174) goto LAB_00151171;
            uVar187 = (psVar194->x).n[0];
            uVar200 = (psVar194->x).n[1];
            if (0 < (int)uVar174) {
              uVar183 = (ulong)(uVar174 - 1 >> 1);
              psStack_5d8 = (secp256k1_gej *)0x150f98;
              secp256k1_ge_set_xy((secp256k1_ge *)auStack_598,
                                  (secp256k1_fe *)((long)(&psVar184->x)[uVar183].n + uVar187),
                                  (secp256k1_fe *)((long)&in_RCX->x + uVar183 * 0x68 + uVar200));
LAB_00151041:
              a_00 = (secp256k1_gej *)0x0;
              psStack_5d8 = (secp256k1_gej *)0x151053;
              psVar193 = psStack_5b0;
              secp256k1_gej_add_ge_var
                        (psStack_5b0,psStack_5b0,(secp256k1_ge *)auStack_598,(secp256k1_fe *)0x0);
              psVar191 = psStack_5c0;
              psVar194 = psStack_5a0;
              goto LAB_0015105d;
            }
            a_00 = (secp256k1_gej *)((ulong)(~uVar174 >> 1) * 0x30);
            psVar191 = (secp256k1_gej *)((long)(a_00->x).n + (long)(psVar184->x).n + uVar187);
            psStack_5d8 = (secp256k1_gej *)0x150fc3;
            secp256k1_ge_set_xy((secp256k1_ge *)auStack_598,(secp256k1_fe *)psVar191,
                                (secp256k1_fe *)
                                ((long)&in_RCX->x + (ulong)(~uVar174 >> 1) * 0x68 + uVar200));
            psVar194 = (secp256k1_gej *)(auStack_598 + 0x30);
            psStack_5d8 = (secp256k1_gej *)0x150fd0;
            psVar193 = psVar194;
            secp256k1_fe_verify((secp256k1_fe *)psVar194);
            if ((int)uStack_540 < 2) {
              auStack_598._48_8_ = 0x3ffffbfffff0bc - auStack_598._48_8_;
              uStack_560 = 0x3ffffffffffffc - uStack_560;
              uStack_558 = 0x3ffffffffffffc - uStack_558;
              uStack_550 = 0x3ffffffffffffc - uStack_550;
              uStack_548 = 0x3fffffffffffc - uStack_548;
              uStack_540._0_4_ = 2;
              uStack_540._4_4_ = 0;
              psStack_5d8 = (secp256k1_gej *)0x15103c;
              secp256k1_fe_verify((secp256k1_fe *)psVar194);
              goto LAB_00151041;
            }
            goto LAB_0015117b;
          }
LAB_0015105d:
          iVar175 = 0x410;
          psVar189 = (secp256k1_gej *)(psVar189[6].z.n + 4);
          in_R8 = (secp256k1_gej *)(in_R8[6].z.n + 4);
          in_RCX = (secp256k1_gej *)(in_RCX[5].y.n + 3);
          psVar184 = (secp256k1_gej *)(psVar184[2].y.n + 4);
          psVar180 = (secp256k1_gej *)&psVar180[-1].field_0x97;
        } while (psVar180 != (secp256k1_gej *)0x0);
      }
      psVar193 = psStack_5b0;
      psVar179 = (secp256k1_gej *)&psVar191[-1].field_0x97;
      if (((long)psVar191 <= (long)puStack_5b8) &&
         (iVar1 = *(int *)((long)asStack_2b0[0].x.n + (long)psVar179 * 4), iVar1 != 0)) {
        psStack_5d8 = (secp256k1_gej *)0x1510b1;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)auStack_598,secp256k1_pre_g,iVar1,(int)a_00);
        a_00 = (secp256k1_gej *)auStack_530;
        psStack_5d8 = (secp256k1_gej *)0x1510ca;
        secp256k1_gej_add_zinv_var
                  (psVar193,psVar193,(secp256k1_ge *)auStack_598,(secp256k1_fe *)a_00);
        psVar191 = psStack_5c0;
        iVar175 = extraout_EAX_01;
      }
      if (((long)psVar191 <= (long)uStack_5a8) &&
         (iVar1 = *(int *)((long)asStack_4c0[0].d + (long)psVar179 * 4), iVar1 != 0)) {
        psStack_5d8 = (secp256k1_gej *)0x1510f8;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)auStack_598,secp256k1_pre_g_128,iVar1,(int)a_00);
        a_00 = (secp256k1_gej *)auStack_530;
        psStack_5d8 = (secp256k1_gej *)0x151111;
        secp256k1_gej_add_zinv_var
                  (psVar193,psVar193,(secp256k1_ge *)auStack_598,(secp256k1_fe *)a_00);
        psVar191 = psStack_5c0;
        iVar175 = extraout_EAX_02;
      }
      psStack_5d0 = (secp256k1_gej *)&psStack_5d0[-1].field_0x94;
    } while (1 < (long)psVar191);
  }
  if (psVar193->infinity == 0) {
    psStack_5d8 = (secp256k1_gej *)0x151146;
    secp256k1_fe_mul(&psVar193->z,&psVar193->z,(secp256k1_fe *)auStack_530);
    iVar175 = extraout_EAX_03;
  }
  return iVar175;
LAB_00151180:
  psStack_5d8 = (secp256k1_gej *)0x151185;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_00151185:
  psStack_5d8 = (secp256k1_gej *)secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  psStack_630 = psVar193;
  auStack_628._40_8_ = psVar184;
  psStack_5f8 = in_R8;
  psStack_5f0 = in_RCX;
  psStack_5e8 = psVar194;
  psStack_5e0 = psVar180;
  psStack_5d8 = psVar189;
  if (psVar193 == (secp256k1_gej *)0x0) {
LAB_001512e4:
    psStack_640 = (secp256k1_gej *)0x1512e9;
    secp256k1_ecmult_wnaf_cold_5();
LAB_001512e9:
    psStack_640 = (secp256k1_gej *)0x1512ee;
    secp256k1_ecmult_wnaf_cold_4();
LAB_001512ee:
    psStack_640 = (secp256k1_gej *)0x1512f3;
    secp256k1_ecmult_wnaf_cold_3();
  }
  else {
    in_R8 = extraout_RDX_00;
    if (extraout_RDX_00 == (secp256k1_gej *)0x0) goto LAB_001512e9;
    uVar174 = (uint)a_00;
    psVar184 = (secp256k1_gej *)((ulong)a_00 & 0xffffffff);
    in_R8 = extraout_RDX_00;
    if ((int)uVar174 < 2) goto LAB_001512ee;
    iVar175 = (int)psVar191;
    psVar189 = (secp256k1_gej *)((ulong)psVar191 & 0xffffffff);
    uVar183 = (ulong)psVar191 & 0xffffffff;
    psVar180 = (secp256k1_gej *)0x0;
    psVar191 = (secp256k1_gej *)0x0;
    psStack_640 = (secp256k1_gej *)0x1511d4;
    psVar179 = a_00;
    memset(psVar193,0,uVar183 << 2);
    auStack_628._24_8_ = (extraout_RDX_00->x).n[3];
    auStack_628._16_8_ = (extraout_RDX_00->x).n[2];
    auStack_628._0_8_ = (extraout_RDX_00->x).n[0];
    auStack_628._8_8_ = (extraout_RDX_00->x).n[1];
    iStack_634 = 1;
    if ((long)auStack_628._24_8_ < 0) {
      psVar191 = (secp256k1_gej *)auStack_628;
      psStack_640 = (secp256k1_gej *)0x151206;
      psVar193 = psVar191;
      secp256k1_scalar_negate((secp256k1_scalar *)psVar191,(secp256k1_scalar *)psVar191);
      iStack_634 = -1;
    }
    if (iVar175 < 1) {
      a_00 = (secp256k1_gej *)CONCAT71((int7)((ulong)psVar179 >> 8),1);
      iVar175 = 0;
      in_R8 = extraout_RDX_00;
    }
    else {
      psVar194 = (secp256k1_gej *)(ulong)(uVar174 - 1);
      in_R8 = (secp256k1_gej *)0x0;
      psVar179 = (secp256k1_gej *)0xffffffff;
      in_RCX = (secp256k1_gej *)0x0;
      do {
        psVar180 = in_RCX;
        uVar176 = (uint)psVar180;
        uVar183 = *(ulong *)(auStack_628 + ((ulong)psVar180 >> 6) * 8);
        if ((uint)((uVar183 >> ((ulong)psVar180 & 0x3f) & 1) != 0) == (uint)in_R8) {
          uVar176 = uVar176 + 1;
          psVar180 = psVar179;
        }
        else {
          uVar177 = iVar175 - uVar176;
          if ((int)uVar174 <= (int)(iVar175 - uVar176)) {
            uVar177 = uVar174;
          }
          psVar193 = (secp256k1_gej *)auStack_628;
          psStack_640 = (secp256k1_gej *)0x151263;
          psVar191 = psVar180;
          uVar178 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar193,uVar176,uVar177);
          uVar178 = uVar178 + (uint)in_R8;
          bVar203 = (uVar178 >> (uVar174 - 1 & 0x1f) & 1) != 0;
          in_R8 = (secp256k1_gej *)(ulong)bVar203;
          uVar183 = (ulong)(int)uVar176;
          *(uint *)((long)(psStack_630->x).n + uVar183 * 4) =
               (uVar178 - ((uint)bVar203 << ((byte)a_00 & 0x1f))) * iStack_634;
          uVar176 = uVar177 + uVar176;
        }
        in_RCX = (secp256k1_gej *)(ulong)uVar176;
        psVar179 = psVar180;
      } while ((int)uVar176 < iVar175);
      a_00 = (secp256k1_gej *)CONCAT71((int7)(uVar183 >> 8),(int)in_R8 == 0);
      iVar175 = (int)psVar180 + 1;
      psVar180 = in_RCX;
    }
    if ((char)a_00 != '\0') {
      if ((int)psVar180 < 0x100) {
        do {
          a_00 = *(secp256k1_gej **)(auStack_628 + ((ulong)psVar180 >> 6) * 8);
          if (((ulong)a_00 >> ((ulong)psVar180 & 0x3f) & 1) != 0) {
            psStack_640 = (secp256k1_gej *)0x1512e4;
            secp256k1_ecmult_wnaf_cold_2();
            goto LAB_001512e4;
          }
          uVar174 = (int)psVar180 + 1;
          psVar180 = (secp256k1_gej *)(ulong)uVar174;
        } while (uVar174 != 0x100);
      }
      return iVar175;
    }
  }
  psStack_640 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_648 = psVar184;
  psStack_640 = psVar194;
  if ((extraout_RDX_01 & 1) == 0) {
    psStack_658 = (secp256k1_gej *)0x1513bd;
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    psVar179 = psVar193;
LAB_001513bd:
    psStack_658 = (secp256k1_gej *)0x1513c2;
    secp256k1_ecmult_table_get_ge_storage_cold_1();
LAB_001513c2:
    psStack_658 = (secp256k1_gej *)0x1513c7;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
  }
  else {
    uVar174 = (uint)extraout_RDX_01;
    psVar179 = psVar193;
    if ((int)uVar174 < -0x3fff) goto LAB_001513bd;
    if (0x3fff < (int)uVar174) goto LAB_001513c2;
    if (0 < (int)uVar174) {
      secp256k1_ge_from_storage
                ((secp256k1_ge *)psVar193,
                 (secp256k1_ge_storage *)((long)&psVar191->x + (ulong)(uVar174 - 1 >> 1) * 0x40));
      return extraout_EAX_04;
    }
    psVar191 = (secp256k1_gej *)((long)&psVar191->x + (ulong)(~uVar174 >> 1) * 0x40);
    psStack_658 = (secp256k1_gej *)0x151351;
    secp256k1_ge_from_storage((secp256k1_ge *)psVar193,(secp256k1_ge_storage *)psVar191);
    psVar194 = (secp256k1_gej *)&psVar193->y;
    psStack_658 = (secp256k1_gej *)0x15135d;
    psVar179 = psVar194;
    secp256k1_fe_verify((secp256k1_fe *)psVar194);
    psVar184 = psVar193;
    if ((psVar193->y).magnitude < 2) {
      uVar187 = (psVar193->y).n[1];
      uVar200 = (psVar193->y).n[2];
      uVar202 = (psVar193->y).n[3];
      (psVar193->y).n[0] = 0x3ffffbfffff0bc - (psVar193->y).n[0];
      (psVar193->y).n[1] = 0x3ffffffffffffc - uVar187;
      (psVar193->y).n[2] = 0x3ffffffffffffc - uVar200;
      (psVar193->y).n[3] = 0x3ffffffffffffc - uVar202;
      (psVar193->y).n[4] = 0x3fffffffffffc - (psVar193->y).n[4];
      (psVar193->y).magnitude = 2;
      (psVar193->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar194);
      return extraout_EAX_05;
    }
  }
  psStack_658 = (secp256k1_gej *)secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  psVar193 = psVar191;
  auStack_6b8._56_8_ = psVar184;
  auStack_6b8._64_8_ = in_R8;
  auStack_6b8._72_8_ = in_RCX;
  auStack_6b8._80_8_ = psVar194;
  auStack_6b8._88_8_ = psVar180;
  psStack_658 = psVar189;
  secp256k1_ge_verify(a_01);
  secp256k1_fe_verify(&a_00->x);
  if (psVar191->infinity == 0) {
    if (a_01->infinity != 0) {
      pvVar182 = memcpy(psVar179,psVar191,0x98);
      return (int)pvVar182;
    }
    psVar194 = (secp256k1_gej *)&psVar191->z;
    psVar180 = (secp256k1_gej *)(auStack_748 + 0x60);
    psVar193 = psVar194;
    secp256k1_fe_mul((secp256k1_fe *)psVar180,(secp256k1_fe *)psVar194,&a_00->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (8 < (int)uStack_6c0) goto LAB_0015263a;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auStack_748._96_8_ * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uStack_6d0;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uStack_6e0 * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uStack_6d8;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uStack_6c8;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uStack_6c8;
    uVar190 = SUB168(auVar24 * auVar100,0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar190 & 0xfffffffffffff;
    auVar205 = auVar23 * auVar99 + auVar22 * auVar98 + auVar25 * ZEXT816(0x1000003d10);
    uVar183 = auVar205._0_8_;
    auStack_7b8._0_8_ = uVar183 & 0xfffffffffffff;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = uVar183 >> 0x34 | auVar205._8_8_ << 0xc;
    uVar183 = uStack_6c8 * 2;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auStack_748._96_8_;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar183;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uStack_6e0 * 2;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uStack_6d0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uStack_6d8;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uStack_6d8;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar190 >> 0x34 | SUB168(auVar24 * auVar100,8) << 0xc;
    auVar205 = auVar26 * auVar101 + auVar153 + auVar27 * auVar102 + auVar28 * auVar103 +
               auVar29 * ZEXT816(0x1000003d10);
    auStack_818._48_8_ = auVar205._0_8_;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = (ulong)auStack_818._48_8_ >> 0x34 | auVar205._8_8_ << 0xc;
    auStack_818._0_8_ = (auStack_818._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_818._48_8_ = auStack_818._48_8_ & 0xffffffffffff;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = auStack_748._96_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = auStack_748._96_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uStack_6e0;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar183;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uStack_6d8 * 2;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uStack_6d0;
    auVar205 = auVar31 * auVar105 + auVar154 + auVar32 * auVar106;
    uVar190 = auVar205._0_8_;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = (uVar190 & 0xfffffffffffff) << 4 | auStack_818._0_8_;
    auVar205 = auVar30 * auVar104 + ZEXT816(0x1000003d1) * auVar107;
    uVar190 = auVar205._0_8_;
    auStack_748._48_8_ = uVar190 & 0xfffffffffffff;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auStack_748._96_8_ * 2;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uStack_6e0;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uStack_6d8;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar183;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uStack_6d0;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uStack_6d0;
    auVar22 = auVar34 * auVar109 + auVar156 + auVar35 * auVar110;
    uVar190 = auVar22._0_8_;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar190 & 0xfffffffffffff;
    auVar205 = auVar33 * auVar108 + auVar155 + auVar36 * ZEXT816(0x1000003d10);
    uVar195 = auVar205._0_8_;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar190 >> 0x34 | auVar22._8_8_ << 0xc;
    auStack_748._56_8_ = uVar195 & 0xfffffffffffff;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar195 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auStack_748._96_8_ * 2;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uStack_6d8;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uStack_6e0;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uStack_6e0;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uStack_6d0;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar183;
    auVar158 = auVar39 * auVar113 + auVar158;
    uVar183 = auVar158._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar183 & 0xfffffffffffff;
    auVar205 = auVar37 * auVar111 + auVar157 + auVar38 * auVar112 + auVar40 * ZEXT816(0x1000003d10);
    uVar190 = auVar205._0_8_;
    auStack_748._64_8_ = uVar190 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = (uVar190 >> 0x34 | auVar205._8_8_ << 0xc) + auStack_7b8._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar183 >> 0x34 | auVar158._8_8_ << 0xc;
    auVar159 = auVar41 * ZEXT816(0x1000003d10) + auVar159;
    uVar183 = auVar159._0_8_;
    auStack_748._72_8_ = uVar183 & 0xfffffffffffff;
    auStack_748._80_8_ = (uVar183 >> 0x34 | auVar159._8_8_ << 0xc) + auStack_818._48_8_;
    auStack_748._88_4_ = 1;
    auStack_748._92_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_748 + 0x30));
    auStack_7b8._0_8_ = (psVar191->x).n[0];
    auStack_7b8._8_8_ = (psVar191->x).n[1];
    auStack_7b8._16_8_ = (psVar191->x).n[2];
    auStack_7b8._24_8_ = (psVar191->x).n[3];
    auStack_7b8._32_8_ = (psVar191->x).n[4];
    auStack_7b8._40_4_ = (psVar191->x).magnitude;
    auStack_7b8._44_4_ = (psVar191->x).normalized;
    psVar180 = (secp256k1_gej *)auStack_7b8;
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    uVar183 = ((ulong)auStack_7b8._32_8_ >> 0x30) * 0x1000003d1 + auStack_7b8._0_8_;
    uVar190 = (uVar183 >> 0x34) + auStack_7b8._8_8_;
    uVar195 = (uVar190 >> 0x34) + auStack_7b8._16_8_;
    uVar196 = (uVar195 >> 0x34) + auStack_7b8._24_8_;
    auStack_7b8._24_8_ = uVar196 & 0xfffffffffffff;
    auStack_7b8._32_8_ = (uVar196 >> 0x34) + (auStack_7b8._32_8_ & 0xffffffffffff);
    auStack_7b8._16_8_ = uVar195 & 0xfffffffffffff;
    auStack_7b8._8_8_ = uVar190 & 0xfffffffffffff;
    auStack_7b8._0_8_ = uVar183 & 0xfffffffffffff;
    auStack_7b8._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_818 + 0x30),&a_01->x,
                     (secp256k1_fe *)(auStack_748 + 0x30));
    auStack_818._0_8_ = (psVar191->y).n[0];
    auStack_818._8_8_ = (psVar191->y).n[1];
    auStack_818._16_8_ = (psVar191->y).n[2];
    auStack_818._24_8_ = (psVar191->y).n[3];
    auStack_818._32_8_ = (psVar191->y).n[4];
    auStack_818._40_4_ = (psVar191->y).magnitude;
    auStack_818._44_4_ = (psVar191->y).normalized;
    secp256k1_fe_verify((secp256k1_fe *)auStack_818);
    uVar183 = ((ulong)auStack_818._32_8_ >> 0x30) * 0x1000003d1 + auStack_818._0_8_;
    uVar190 = (uVar183 >> 0x34) + auStack_818._8_8_;
    uVar195 = (uVar190 >> 0x34) + auStack_818._16_8_;
    uVar196 = (uVar195 >> 0x34) + auStack_818._24_8_;
    auStack_818._24_8_ = uVar196 & 0xfffffffffffff;
    auStack_818._32_8_ = (uVar196 >> 0x34) + (auStack_818._32_8_ & 0xffffffffffff);
    auStack_818._16_8_ = uVar195 & 0xfffffffffffff;
    auStack_818._8_8_ = uVar190 & 0xfffffffffffff;
    auStack_818._0_8_ = uVar183 & 0xfffffffffffff;
    auStack_818._40_4_ = 1;
    secp256k1_fe_verify((secp256k1_fe *)auStack_818);
    psVar193 = (secp256k1_gej *)auStack_748;
    secp256k1_fe_mul((secp256k1_fe *)psVar193,&a_01->y,(secp256k1_fe *)(auStack_748 + 0x30));
    secp256k1_fe_mul((secp256k1_fe *)psVar193,(secp256k1_fe *)psVar193,
                     (secp256k1_fe *)(auStack_748 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (1 < (int)auStack_7b8._40_4_) goto LAB_0015263f;
    auStack_8a8._96_8_ = 0x3ffffbfffff0bc - auStack_7b8._0_8_;
    uStack_840 = 0x3ffffffffffffc - auStack_7b8._8_8_;
    uStack_838 = 0x3ffffffffffffc - auStack_7b8._16_8_;
    uStack_830 = 0x3ffffffffffffc - auStack_7b8._24_8_;
    uStack_828 = 0x3fffffffffffc - auStack_7b8._32_8_;
    uStack_820 = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x60));
    psVar180 = (secp256k1_gej *)(auStack_818 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (0x20 < iStack_7c0 + (int)uStack_820) goto LAB_00152644;
    auStack_8a8._96_8_ = auStack_8a8._96_8_ + auStack_818._48_8_;
    uStack_840 = uStack_840 + uStack_7e0;
    uStack_838 = uStack_838 + uStack_7d8;
    uStack_830 = uStack_830 + uStack_7d0;
    uStack_828 = uStack_828 + uStack_7c8;
    uStack_820 = (ulong)(uint)(iStack_7c0 + (int)uStack_820);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x60));
    psVar180 = (secp256k1_gej *)auStack_748;
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (1 < (int)auStack_748._40_4_) goto LAB_00152649;
    auStack_8a8._48_8_ = 0x3ffffbfffff0bc - auStack_748._0_8_;
    auStack_8a8._56_8_ = 0x3ffffffffffffc - auStack_748._8_8_;
    auStack_8a8._64_8_ = 0x3ffffffffffffc - auStack_748._16_8_;
    auStack_8a8._72_8_ = 0x3ffffffffffffc - auStack_748._24_8_;
    auStack_8a8._80_8_ = 0x3fffffffffffc - auStack_748._32_8_;
    auStack_8a8._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x30));
    psVar180 = (secp256k1_gej *)auStack_818;
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (0x20 < (int)(auStack_818._40_4_ + auStack_8a8._88_4_)) goto LAB_0015264e;
    auStack_8a8._48_8_ = auStack_8a8._48_8_ + auStack_818._0_8_;
    auStack_8a8._56_8_ = auStack_8a8._56_8_ + auStack_818._8_8_;
    auStack_8a8._64_8_ = auStack_8a8._64_8_ + auStack_818._16_8_;
    auStack_8a8._72_8_ = auStack_8a8._72_8_ + auStack_818._24_8_;
    auStack_8a8._80_8_ = auStack_8a8._80_8_ + auStack_818._32_8_;
    auStack_8a8._92_4_ = 0;
    auStack_8a8._88_4_ = auStack_818._40_4_ + auStack_8a8._88_4_;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x30));
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x60));
    uVar183 = (uStack_828 >> 0x30) * 0x1000003d1 + auStack_8a8._96_8_;
    if (((uVar183 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar183 & 0xfffffffffffff) == 0)) {
      uVar190 = (uVar183 >> 0x34) + uStack_840;
      uVar195 = (uVar190 >> 0x34) + uStack_838;
      uVar196 = (uVar195 >> 0x34) + uStack_830;
      uVar201 = (uVar196 >> 0x34) + (uStack_828 & 0xffffffffffff);
      if ((((uVar190 | uVar183 | uVar195 | uVar196) & 0xfffffffffffff) == 0 && uVar201 == 0) ||
         ((uVar183 + 0x1000003d0 & uVar190 & uVar195 & uVar196 & (uVar201 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x30));
        uVar183 = ((ulong)auStack_8a8._80_8_ >> 0x30) * 0x1000003d1 + auStack_8a8._48_8_;
        if (((uVar183 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar183 & 0xfffffffffffff) == 0))
        {
          uVar190 = (uVar183 >> 0x34) + auStack_8a8._56_8_;
          uVar195 = (uVar190 >> 0x34) + auStack_8a8._64_8_;
          uVar196 = (uVar195 >> 0x34) + auStack_8a8._72_8_;
          uVar201 = (uVar196 >> 0x34) + (auStack_8a8._80_8_ & 0xffffffffffff);
          if ((((uVar190 | uVar183 | uVar195 | uVar196) & 0xfffffffffffff) == 0 && uVar201 == 0) ||
             ((uVar183 + 0x1000003d0 & uVar190 & uVar195 & uVar196 & (uVar201 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(psVar179,psVar191,(secp256k1_fe *)0x0);
            return extraout_EAX_09;
          }
        }
        secp256k1_gej_set_infinity(psVar179);
        return extraout_EAX_08;
      }
    }
    psVar179->infinity = 0;
    psVar180 = (secp256k1_gej *)(auStack_8a8 + 0x60);
    secp256k1_fe_mul(&psVar179->z,(secp256k1_fe *)psVar194,(secp256k1_fe *)psVar180);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (8 < (int)uStack_820) goto LAB_00152653;
    psVar180 = (secp256k1_gej *)auStack_6b8;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_8a8._96_8_ * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uStack_830;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uStack_840 * 2;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uStack_838;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uStack_828;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uStack_828;
    uVar190 = SUB168(auVar44 * auVar116,0);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar190 & 0xfffffffffffff;
    auVar205 = auVar43 * auVar115 + auVar42 * auVar114 + auVar45 * ZEXT816(0x1000003d10);
    uVar183 = auVar205._0_8_;
    auStack_8a8._0_8_ = uVar183 & 0xfffffffffffff;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar183 >> 0x34 | auVar205._8_8_ << 0xc;
    uVar183 = uStack_828 * 2;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auStack_8a8._96_8_;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar183;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_840 * 2;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uStack_830;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uStack_838;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uStack_838;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar190 >> 0x34 | SUB168(auVar44 * auVar116,8) << 0xc;
    auVar205 = auVar46 * auVar117 + auVar160 + auVar47 * auVar118 + auVar48 * auVar119 +
               auVar49 * ZEXT816(0x1000003d10);
    uVar190 = auVar205._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    psVar194 = (secp256k1_gej *)(uVar190 & 0xffffffffffff);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auStack_8a8._96_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = auStack_8a8._96_8_;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uStack_840;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar183;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uStack_838 * 2;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uStack_830;
    auVar205 = auVar51 * auVar121 + auVar161 + auVar52 * auVar122;
    uVar195 = auVar205._0_8_;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar195 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = (uVar195 & 0xfffffffffffff) << 4 | (uVar190 & 0xfffffffffffff) >> 0x30;
    auVar205 = auVar50 * auVar120 + ZEXT816(0x1000003d1) * auVar123;
    uVar190 = auVar205._0_8_;
    auStack_6b8._0_8_ = uVar190 & 0xfffffffffffff;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_8a8._96_8_ * 2;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uStack_840;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uStack_838;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar183;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uStack_830;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uStack_830;
    auVar22 = auVar54 * auVar125 + auVar163 + auVar55 * auVar126;
    uVar190 = auVar22._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar190 & 0xfffffffffffff;
    auVar205 = auVar53 * auVar124 + auVar162 + auVar56 * ZEXT816(0x1000003d10);
    uVar195 = auVar205._0_8_;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar190 >> 0x34 | auVar22._8_8_ << 0xc;
    auStack_6b8._8_8_ = uVar195 & 0xfffffffffffff;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar195 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auStack_8a8._96_8_ * 2;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uStack_838;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uStack_840;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uStack_840;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_830;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar183;
    auVar165 = auVar59 * auVar129 + auVar165;
    uVar183 = auVar165._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar183 & 0xfffffffffffff;
    auVar205 = auVar57 * auVar127 + auVar164 + auVar58 * auVar128 + auVar60 * ZEXT816(0x1000003d10);
    uVar190 = auVar205._0_8_;
    auStack_6b8._16_8_ = uVar190 & 0xfffffffffffff;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = (uVar190 >> 0x34 | auVar205._8_8_ << 0xc) + auStack_8a8._0_8_;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar183 >> 0x34 | auVar165._8_8_ << 0xc;
    auVar166 = auVar61 * ZEXT816(0x1000003d10) + auVar166;
    uVar183 = auVar166._0_8_;
    auStack_6b8._24_8_ = uVar183 & 0xfffffffffffff;
    auStack_6b8._32_8_ = (long)(psVar194->x).n + (uVar183 >> 0x34 | auVar166._8_8_ << 0xc);
    auStack_6b8._40_4_ = 1;
    auStack_6b8._44_4_ = 0;
    auStack_7b8._48_8_ = psVar194;
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    if (1 < (int)auStack_6b8._40_4_) goto LAB_00152658;
    auStack_6b8._0_8_ = 0x3ffffbfffff0bc - auStack_6b8._0_8_;
    auStack_6b8._8_8_ = 0x3ffffffffffffc - auStack_6b8._8_8_;
    auStack_6b8._16_8_ = 0x3ffffffffffffc - auStack_6b8._16_8_;
    auStack_6b8._24_8_ = 0x3ffffffffffffc - auStack_6b8._24_8_;
    auStack_6b8._32_8_ = 0x3fffffffffffc - auStack_6b8._32_8_;
    auStack_6b8._40_4_ = 2;
    auStack_6b8._44_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)auStack_6b8);
    secp256k1_fe_mul((secp256k1_fe *)auStack_8a8,(secp256k1_fe *)auStack_6b8,
                     (secp256k1_fe *)(auStack_8a8 + 0x60));
    psVar194 = (secp256k1_gej *)auStack_7b8;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_7b8 + 0x30),(secp256k1_fe *)psVar194,
                     (secp256k1_fe *)auStack_6b8);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_8a8 + 0x30));
    psVar180 = psVar179;
    if (8 < (int)auStack_8a8._88_4_) goto LAB_0015265d;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = auStack_8a8._48_8_ * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = auStack_8a8._72_8_;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = auStack_8a8._56_8_ * 2;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_8a8._64_8_;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = auStack_8a8._80_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_8a8._80_8_;
    uVar190 = SUB168(auVar64 * auVar132,0);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar190 & 0xfffffffffffff;
    auVar205 = auVar63 * auVar131 + auVar62 * auVar130 + auVar65 * ZEXT816(0x1000003d10);
    uVar195 = auVar205._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar195 >> 0x34 | auVar205._8_8_ << 0xc;
    uVar183 = auStack_8a8._80_8_ * 2;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = auStack_8a8._48_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar183;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = auStack_8a8._56_8_ * 2;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_8a8._72_8_;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = auStack_8a8._64_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_8a8._64_8_;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = uVar190 >> 0x34 | SUB168(auVar64 * auVar132,8) << 0xc;
    auVar205 = auVar66 * auVar133 + auVar167 + auVar67 * auVar134 + auVar68 * auVar135 +
               auVar69 * ZEXT816(0x1000003d10);
    uVar190 = auVar205._0_8_;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    uStack_758 = (uVar190 & 0xfffffffffffff) >> 0x30;
    psVar194 = (secp256k1_gej *)(uVar190 & 0xffffffffffff);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_8a8._48_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_8a8._48_8_;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = auStack_8a8._56_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar183;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = auStack_8a8._64_8_ * 2;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auStack_8a8._72_8_;
    auVar205 = auVar71 * auVar137 + auVar168 + auVar72 * auVar138;
    uVar190 = auVar205._0_8_;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = (uVar190 & 0xfffffffffffff) << 4 | uStack_758;
    auVar205 = auVar70 * auVar136 + ZEXT816(0x1000003d1) * auVar139;
    uVar190 = auVar205._0_8_;
    (psVar179->x).n[0] = uVar190 & 0xfffffffffffff;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar190 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = auStack_8a8._48_8_ * 2;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auStack_8a8._56_8_;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = auStack_8a8._64_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar183;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auStack_8a8._72_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = auStack_8a8._72_8_;
    auVar22 = auVar74 * auVar141 + auVar170 + auVar75 * auVar142;
    uVar190 = auVar22._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar190 & 0xfffffffffffff;
    auVar205 = auVar73 * auVar140 + auVar169 + auVar76 * ZEXT816(0x1000003d10);
    uVar196 = auVar205._0_8_;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar190 >> 0x34 | auVar22._8_8_ << 0xc;
    (psVar179->x).n[1] = uVar196 & 0xfffffffffffff;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar196 >> 0x34 | auVar205._8_8_ << 0xc;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_8a8._48_8_ * 2;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_8a8._64_8_;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = auStack_8a8._56_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = auStack_8a8._56_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = auStack_8a8._72_8_;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar183;
    auVar172 = auVar79 * auVar145 + auVar172;
    uVar183 = auVar172._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar183 & 0xfffffffffffff;
    auVar205 = auVar77 * auVar143 + auVar171 + auVar78 * auVar144 + auVar80 * ZEXT816(0x1000003d10);
    uVar190 = auVar205._0_8_;
    (psVar179->x).n[2] = uVar190 & 0xfffffffffffff;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = (uVar190 >> 0x34 | auVar205._8_8_ << 0xc) + (uVar195 & 0xfffffffffffff);
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar183 >> 0x34 | auVar172._8_8_ << 0xc;
    auVar173 = auVar81 * ZEXT816(0x1000003d10) + auVar173;
    uVar183 = auVar173._0_8_;
    (psVar179->x).n[3] = uVar183 & 0xfffffffffffff;
    (psVar179->x).n[4] = (long)(psVar194->x).n + (uVar183 >> 0x34 | auVar173._8_8_ << 0xc);
    (psVar179->x).magnitude = 1;
    (psVar179->x).normalized = 0;
    psStack_750 = psVar194;
    secp256k1_fe_verify(&psVar179->x);
    secp256k1_fe_verify(&psVar179->x);
    psVar180 = (secp256k1_gej *)auStack_8a8;
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    iVar175 = auStack_8a8._40_4_ + (psVar179->x).magnitude;
    if (0x20 < iVar175) goto LAB_00152662;
    uVar187 = (psVar179->x).n[1];
    uVar200 = (psVar179->x).n[2];
    uVar202 = (psVar179->x).n[3];
    (psVar179->x).n[0] = (psVar179->x).n[0] + auStack_8a8._0_8_;
    (psVar179->x).n[1] = uVar187 + auStack_8a8._8_8_;
    (psVar179->x).n[2] = uVar200 + auStack_8a8._16_8_;
    (psVar179->x).n[3] = uVar202 + auStack_8a8._24_8_;
    puVar199 = (psVar179->x).n + 4;
    *puVar199 = *puVar199 + auStack_8a8._32_8_;
    (psVar179->x).magnitude = iVar175;
    (psVar179->x).normalized = 0;
    secp256k1_fe_verify(&psVar179->x);
    secp256k1_fe_verify(&psVar179->x);
    psVar180 = (secp256k1_gej *)(auStack_7b8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    iVar175 = iStack_760 + (psVar179->x).magnitude;
    if (0x20 < iVar175) goto LAB_00152667;
    uVar187 = (psVar179->x).n[1];
    uVar200 = (psVar179->x).n[2];
    uVar202 = (psVar179->x).n[3];
    psVar180 = (secp256k1_gej *)(auStack_7b8 + 0x30);
    (psVar179->x).n[0] = (long)((secp256k1_fe *)auStack_7b8._48_8_)->n + (psVar179->x).n[0];
    (psVar179->x).n[1] = uVar187 + uStack_780;
    (psVar179->x).n[2] = uVar200 + uStack_778;
    (psVar179->x).n[3] = uVar202 + uStack_770;
    puVar199 = (psVar179->x).n + 4;
    *puVar199 = *puVar199 + uStack_768;
    (psVar179->x).magnitude = iVar175;
    (psVar179->x).normalized = 0;
    secp256k1_fe_verify(&psVar179->x);
    secp256k1_fe_verify(&psVar179->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    iVar175 = iStack_760 + (psVar179->x).magnitude;
    if (0x20 < iVar175) goto LAB_0015266c;
    uVar187 = (psVar179->x).n[1];
    uVar200 = (psVar179->x).n[2];
    uVar202 = (psVar179->x).n[3];
    (psVar179->x).n[0] = (long)((secp256k1_fe *)auStack_7b8._48_8_)->n + (psVar179->x).n[0];
    (psVar179->x).n[1] = uVar187 + uStack_780;
    (psVar179->x).n[2] = uVar200 + uStack_778;
    (psVar179->x).n[3] = uVar202 + uStack_770;
    puVar199 = (psVar179->x).n + 4;
    *puVar199 = *puVar199 + uStack_768;
    (psVar179->x).magnitude = iVar175;
    (psVar179->x).normalized = 0;
    secp256k1_fe_verify(&psVar179->x);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7b8 + 0x30));
    psVar180 = psVar179;
    secp256k1_fe_verify(&psVar179->x);
    iVar175 = (psVar179->x).magnitude + iStack_760;
    if (0x20 < iVar175) goto LAB_00152671;
    auStack_7b8._48_8_ = (long)((secp256k1_fe *)auStack_7b8._48_8_)->n + (psVar179->x).n[0];
    uStack_780 = (psVar179->x).n[1] + uStack_780;
    uStack_778 = (psVar179->x).n[2] + uStack_778;
    uStack_770 = (psVar179->x).n[3] + uStack_770;
    uStack_768 = uStack_768 + (psVar179->x).n[4];
    iStack_75c = 0;
    iStack_760 = iVar175;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7b8 + 0x30));
    psVar197 = &psVar179->y;
    secp256k1_fe_mul(psVar197,(secp256k1_fe *)(auStack_7b8 + 0x30),
                     (secp256k1_fe *)(auStack_8a8 + 0x30));
    psVar180 = (secp256k1_gej *)auStack_8a8;
    psVar194 = psVar180;
    secp256k1_fe_mul((secp256k1_fe *)psVar180,(secp256k1_fe *)psVar180,(secp256k1_fe *)auStack_818);
    secp256k1_fe_verify(psVar197);
    secp256k1_fe_verify((secp256k1_fe *)psVar180);
    iVar175 = auStack_8a8._40_4_ + (psVar179->y).magnitude;
    if (iVar175 < 0x21) {
      uVar187 = (psVar179->y).n[1];
      uVar200 = (psVar179->y).n[2];
      uVar202 = (psVar179->y).n[3];
      (psVar179->y).n[0] = (psVar179->y).n[0] + auStack_8a8._0_8_;
      (psVar179->y).n[1] = uVar187 + auStack_8a8._8_8_;
      (psVar179->y).n[2] = uVar200 + auStack_8a8._16_8_;
      (psVar179->y).n[3] = uVar202 + auStack_8a8._24_8_;
      puVar199 = (psVar179->y).n + 4;
      *puVar199 = *puVar199 + auStack_8a8._32_8_;
      (psVar179->y).magnitude = iVar175;
      (psVar179->y).normalized = 0;
      secp256k1_fe_verify(psVar197);
      secp256k1_gej_verify(psVar179);
      return extraout_EAX_07;
    }
  }
  else {
    psVar179->infinity = a_01->infinity;
    psVar180 = a_00;
    secp256k1_fe_verify(&a_00->x);
    if ((a_00->x).magnitude < 9) {
      psVar197 = (secp256k1_fe *)(auStack_748 + 0x60);
      uVar183 = (a_00->x).n[0];
      uVar190 = (a_00->x).n[1];
      uVar195 = (a_00->x).n[2];
      uVar196 = (a_00->x).n[3];
      uVar201 = (a_00->x).n[4];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar183 * 2;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar196;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar190 * 2;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar195;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar201;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar201;
      uVar181 = SUB168(auVar4 * auVar84,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar181 & 0xfffffffffffff;
      auVar205 = auVar3 * auVar83 + auVar2 * auVar82 + auVar5 * ZEXT816(0x1000003d10);
      uVar186 = auVar205._0_8_;
      auStack_748._48_8_ = uVar186 & 0xfffffffffffff;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar186 >> 0x34 | auVar205._8_8_ << 0xc;
      uVar201 = uVar201 * 2;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar183;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar201;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar190 * 2;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar196;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar195;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar195;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar181 >> 0x34 | SUB168(auVar4 * auVar84,8) << 0xc;
      auVar205 = auVar6 * auVar85 + auVar146 + auVar7 * auVar86 + auVar8 * auVar87 +
                 auVar9 * ZEXT816(0x1000003d10);
      uVar181 = auVar205._0_8_;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar181 >> 0x34 | auVar205._8_8_ << 0xc;
      auStack_818._48_8_ = (uVar181 & 0xfffffffffffff) >> 0x30;
      auStack_7b8._0_8_ = uVar181 & 0xffffffffffff;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar183;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar183;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar190;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar201;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar195 * 2;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar196;
      auVar205 = auVar11 * auVar89 + auVar147 + auVar12 * auVar90;
      uVar181 = auVar205._0_8_;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar181 >> 0x34 | auVar205._8_8_ << 0xc;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | auStack_818._48_8_;
      auVar205 = auVar10 * auVar88 + ZEXT816(0x1000003d1) * auVar91;
      uVar181 = auVar205._0_8_;
      auStack_748._96_8_ = uVar181 & 0xfffffffffffff;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar181 >> 0x34 | auVar205._8_8_ << 0xc;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar183 * 2;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar190;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar195;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar201;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar196;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar196;
      auVar22 = auVar14 * auVar93 + auVar149 + auVar15 * auVar94;
      uVar181 = auVar22._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar181 & 0xfffffffffffff;
      auVar205 = auVar13 * auVar92 + auVar148 + auVar16 * ZEXT816(0x1000003d10);
      uVar186 = auVar205._0_8_;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = uVar181 >> 0x34 | auVar22._8_8_ << 0xc;
      uStack_6e0 = uVar186 & 0xfffffffffffff;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar186 >> 0x34 | auVar205._8_8_ << 0xc;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar183 * 2;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar195;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar190;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar190;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar196;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = uVar201;
      auVar151 = auVar19 * auVar97 + auVar151;
      uVar183 = auVar151._0_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar183 & 0xfffffffffffff;
      auVar205 = auVar17 * auVar95 + auVar150 + auVar18 * auVar96 + auVar20 * ZEXT816(0x1000003d10);
      uVar190 = auVar205._0_8_;
      uStack_6d8 = uVar190 & 0xfffffffffffff;
      auVar152._8_8_ = 0;
      auVar152._0_8_ = (uVar190 >> 0x34 | auVar205._8_8_ << 0xc) + auStack_748._48_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar183 >> 0x34 | auVar151._8_8_ << 0xc;
      auVar152 = auVar21 * ZEXT816(0x1000003d10) + auVar152;
      uVar183 = auVar152._0_8_;
      uStack_6d0 = uVar183 & 0xfffffffffffff;
      uStack_6c8 = (uVar183 >> 0x34 | auVar152._8_8_ << 0xc) + auStack_7b8._0_8_;
      uStack_6c0._0_4_ = 1;
      uStack_6c0._4_4_ = 0;
      secp256k1_fe_verify(psVar197);
      secp256k1_fe_mul((secp256k1_fe *)(auStack_748 + 0x30),psVar197,&a_00->x);
      secp256k1_fe_mul(&psVar179->x,&a_01->x,psVar197);
      secp256k1_fe_mul(&psVar179->y,&a_01->y,(secp256k1_fe *)(auStack_748 + 0x30));
      (psVar179->z).n[0] = 1;
      (psVar179->z).n[1] = 0;
      (psVar179->z).n[2] = 0;
      (psVar179->z).n[3] = 0;
      (psVar179->z).n[4] = 0;
      (psVar179->z).magnitude = 1;
      (psVar179->z).normalized = 1;
      secp256k1_fe_verify(&psVar179->z);
      return extraout_EAX_06;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_0015263a:
    secp256k1_gej_add_zinv_var_cold_14();
LAB_0015263f:
    secp256k1_gej_add_zinv_var_cold_13();
LAB_00152644:
    secp256k1_gej_add_zinv_var_cold_12();
LAB_00152649:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_0015264e:
    psVar194 = psVar193;
    secp256k1_gej_add_zinv_var_cold_10();
LAB_00152653:
    secp256k1_gej_add_zinv_var_cold_9();
LAB_00152658:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_0015265d:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00152662:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00152667:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0015266c:
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00152671:
    secp256k1_gej_add_zinv_var_cold_3();
  }
  secp256k1_gej_add_zinv_var_cold_2();
  if (extraout_EDX < 0x20) {
    uVar174 = (uint)psVar194;
    if (0x100 < extraout_EDX + uVar174) goto LAB_001526e3;
    uVar183 = (ulong)psVar194 >> 6 & 0x3ffffff;
    if ((extraout_EDX + uVar174) - 1 >> 6 != (uint)uVar183) {
      if (uVar174 < 0xc0) {
        bVar204 = (byte)psVar194 & 0x3f;
        uVar174 = (uint)((psVar180->x).n[uVar183] >> bVar204) |
                  (uint)((psVar180->x).n[uVar183 + 1] << 0x40 - bVar204);
        goto LAB_001526cc;
      }
      goto LAB_001526ed;
    }
    if ((extraout_EDX + uVar174) - 1 >> 6 == (uint)uVar183) {
      uVar174 = (uint)((psVar180->x).n[uVar183] >> ((byte)psVar194 & 0x3f));
LAB_001526cc:
      return uVar174 & ~(uint)(-1L << ((byte)extraout_EDX & 0x3f));
    }
  }
  else {
    secp256k1_scalar_get_bits_var_cold_4();
LAB_001526e3:
    secp256k1_scalar_get_bits_var_cold_3();
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_001526ed:
  secp256k1_scalar_get_bits_var_cold_1();
  *(undefined4 *)(psVar180->z).n = 1;
  (psVar180->x).magnitude = 0;
  (psVar180->x).normalized = 1;
  (psVar180->x).n[0] = 0;
  (psVar180->x).n[1] = 0;
  (psVar180->x).n[2] = 0;
  (psVar180->x).n[3] = 0;
  (psVar180->x).n[4] = 0;
  secp256k1_fe_verify(&psVar180->x);
  (psVar180->y).magnitude = 0;
  (psVar180->y).normalized = 1;
  (psVar180->y).n[0] = 0;
  (psVar180->y).n[1] = 0;
  (psVar180->y).n[2] = 0;
  (psVar180->y).n[3] = 0;
  (psVar180->y).n[4] = 0;
  secp256k1_fe_verify(&psVar180->y);
  secp256k1_ge_verify((secp256k1_ge *)psVar180);
  return extraout_EAX_10;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
#ifdef VERIFY
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(a->magnitude <= 1);
    VERIFY_CHECK(b->magnitude <= 31);
#endif
    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}